

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void __thiscall TRM::Model::Model(Model *this,char *filename)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  float *pfVar5;
  istream *piVar6;
  int *piVar7;
  long *plVar8;
  ostream *poVar9;
  size_type sVar10;
  int local_450;
  undefined1 local_44c [4];
  int i_3;
  Vec3i tmp;
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  f;
  int i_2;
  Vec2f uv;
  int i_1;
  Vec3f n;
  int i;
  Vec3f v;
  char trash;
  istringstream local_3d8 [8];
  istringstream iss;
  string local_258 [8];
  string line;
  istream local_230 [8];
  ifstream in;
  char *filename_local;
  Model *this_local;
  
  (this->verts_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verts_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verts_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&this->verts_);
  (this->faces_).
  super__Vector_base<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->faces_).
  super__Vector_base<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces_).
  super__Vector_base<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
  ::vector(&this->faces_);
  (this->norms_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->norms_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->norms_).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&this->norms_);
  (this->uv_).
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uv_).
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uv_).
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector(&this->uv_);
  TGAImage::TGAImage(&this->diffusemap_);
  TGAImage::TGAImage(&this->normalmap_);
  TGAImage::TGAImage(&this->specularmap_);
  std::ifstream::ifstream(local_230);
  std::ifstream::open((char *)local_230,(_Ios_Openmode)filename);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_258);
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_230,local_258);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&v.field_2,pcVar4,(allocator *)((long)&v.field_1 + 3));
      std::__cxx11::istringstream::istringstream(local_3d8,(string *)&v.field_2,_S_in);
      std::__cxx11::string::~string((string *)&v.field_2);
      std::allocator<char>::~allocator((allocator<char> *)((long)&v.field_1 + 3));
      iVar3 = std::__cxx11::string::compare((ulong)local_258,0,(char *)0x2);
      if (iVar3 == 0) {
        std::operator>>((istream *)local_3d8,(char *)((long)&v.field_1 + 2));
        for (n.field_1.y = 0.0; (int)n.field_1 < 3; n.field_1.y = n.field_1.y + 1) {
          pfVar5 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                             ((vec<3,_float,_(glm::qualifier)0> *)&n.field_2,(length_type)n.field_1)
          ;
          std::istream::operator>>((istream *)local_3d8,pfVar5);
        }
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back(&this->verts_,(value_type *)&n.field_2);
      }
      else {
        iVar3 = std::__cxx11::string::compare((ulong)local_258,0,(char *)0x3);
        if (iVar3 == 0) {
          piVar6 = std::operator>>((istream *)local_3d8,(char *)((long)&v.field_1 + 2));
          std::operator>>(piVar6,(char *)((long)&v.field_1 + 2));
          for (uv.field_0.x = 0.0; (int)uv.field_0 < 3; uv.field_0.x = uv.field_0.x + 1) {
            pfVar5 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                               ((vec<3,_float,_(glm::qualifier)0> *)&uv.field_1,
                                (length_type)uv.field_0);
            std::istream::operator>>((istream *)local_3d8,pfVar5);
          }
          std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::push_back(&this->norms_,(value_type *)&uv.field_1);
        }
        else {
          iVar3 = std::__cxx11::string::compare((ulong)local_258,0,(char *)0x3);
          if (iVar3 == 0) {
            piVar6 = std::operator>>((istream *)local_3d8,(char *)((long)&v.field_1 + 2));
            std::operator>>(piVar6,(char *)((long)&v.field_1 + 2));
            for (f.
                 super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                (int)f.
                     super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage < 2;
                f.
                super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                     (int)f.
                          super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
              pfVar5 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                                 ((vec<2,_float,_(glm::qualifier)0> *)
                                  ((long)&f.
                                          super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                                  (int)f.
                                       super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::istream::operator>>((istream *)local_3d8,pfVar5);
            }
            std::
            vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            ::push_back(&this->uv_,
                        (value_type *)
                        ((long)&f.
                                super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          }
          else {
            iVar3 = std::__cxx11::string::compare((ulong)local_258,0,(char *)0x2);
            if (iVar3 == 0) {
              std::
              vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
              ::vector((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                        *)&tmp.field_1);
              std::operator>>((istream *)local_3d8,(char *)((long)&v.field_1 + 2));
              while( true ) {
                piVar7 = glm::vec<3,_int,_(glm::qualifier)0>::operator[]
                                   ((vec<3,_int,_(glm::qualifier)0> *)local_44c,0);
                piVar6 = (istream *)std::istream::operator>>((istream *)local_3d8,piVar7);
                piVar6 = std::operator>>(piVar6,(char *)((long)&v.field_1 + 2));
                piVar7 = glm::vec<3,_int,_(glm::qualifier)0>::operator[]
                                   ((vec<3,_int,_(glm::qualifier)0> *)local_44c,1);
                piVar6 = (istream *)std::istream::operator>>(piVar6,piVar7);
                piVar6 = std::operator>>(piVar6,(char *)((long)&v.field_1 + 2));
                piVar7 = glm::vec<3,_int,_(glm::qualifier)0>::operator[]
                                   ((vec<3,_int,_(glm::qualifier)0> *)local_44c,2);
                plVar8 = (long *)std::istream::operator>>(piVar6,piVar7);
                bVar2 = std::ios::operator_cast_to_bool
                                  ((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
                if (!bVar2) break;
                for (local_450 = 0; local_450 < 3; local_450 = local_450 + 1) {
                  piVar7 = glm::vec<3,_int,_(glm::qualifier)0>::operator[]
                                     ((vec<3,_int,_(glm::qualifier)0> *)local_44c,local_450);
                  *piVar7 = *piVar7 + -1;
                }
                std::
                vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                ::push_back((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                             *)&tmp.field_1,(value_type *)local_44c);
              }
              std::
              vector<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
              ::push_back(&this->faces_,(value_type *)&tmp.field_1);
              std::
              vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
              ::~vector((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                         *)&tmp.field_1);
            }
          }
        }
      }
      std::__cxx11::istringstream::~istringstream(local_3d8);
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,"# v# ");
    sVar10 = std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::size(&this->verts_);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar10);
    poVar9 = std::operator<<(poVar9," f# ");
    sVar10 = std::
             vector<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>,_std::allocator<std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>_>
             ::size(&this->faces_);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar10);
    poVar9 = std::operator<<(poVar9," vt# ");
    sVar10 = std::
             vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ::size(&this->uv_);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar10);
    poVar9 = std::operator<<(poVar9," vn# ");
    sVar10 = std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::size(&this->norms_);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar10);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_258);
  }
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

Model::Model(const char *filename)
    : verts_(),
      faces_(),
      norms_(),
      uv_(),
      diffusemap_(),
      normalmap_(),
      specularmap_() {
  std::ifstream in;
  in.open(filename, std::ifstream::in);
  if (in.fail()) return;
  std::string line;
  while (!in.eof()) {
    std::getline(in, line);
    std::istringstream iss(line.c_str());
    char trash;
    if (!line.compare(0, 2, "v ")) {
      iss >> trash;
      Vec3f v;
      for (int i = 0; i < 3; i++) iss >> v[i];
      verts_.push_back(v);
    } else if (!line.compare(0, 3, "vn ")) {
      iss >> trash >> trash;
      Vec3f n;
      for (int i = 0; i < 3; i++) iss >> n[i];
      norms_.push_back(n);
    } else if (!line.compare(0, 3, "vt ")) {
      iss >> trash >> trash;
      Vec2f uv;
      for (int i = 0; i < 2; i++) iss >> uv[i];
      uv_.push_back(uv);
    } else if (!line.compare(0, 2, "f ")) {
      std::vector<Vec3i> f;
      Vec3i tmp;
      iss >> trash;
      while (iss >> tmp[0] >> trash >> tmp[1] >> trash >> tmp[2]) {
        for (int i = 0; i < 3; i++)
          tmp[i]--;  // in wavefront obj all indices start at 1, not zero
        f.push_back(tmp);
      }
      faces_.push_back(f);
    }
  }
  std::cerr << "# v# " << verts_.size() << " f# " << faces_.size() << " vt# "
            << uv_.size() << " vn# " << norms_.size() << std::endl;
  //    load_texture(filename, "_diffuse.tga", diffusemap_);
  //    load_texture(filename, "_nm_tangent.tga",      normalmap_);
  //    load_texture(filename, "_spec.tga",    specularmap_);
}